

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::FErrorFunc::FErrorFunc(FErrorFunc *this)

{
  undefined8 *in_RDI;
  SubroutineKind in_stack_00000028;
  KnownSystemName in_stack_0000002c;
  SystemSubroutine *in_stack_00000030;
  
  SystemSubroutine::SystemSubroutine(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  *in_RDI = &PTR__FErrorFunc_00ddbe18;
  *(undefined1 *)(in_RDI + 6) = 1;
  return;
}

Assistant:

FErrorFunc() : SystemSubroutine(KnownSystemName::FError, SubroutineKind::Function) {
        hasOutputArgs = true;
    }